

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void cpy_C4(void)

{
  byte bVar1;
  
  except = '\0';
  bVar1 = getbyte(pc);
  _AL = y_reg;
  _AH = RAM[bVar1];
  carry_f = '\x01';
  result_f = '@';
  pc = pc + 1;
  return;
}

Assistant:

void cpy_C4(void) {
    uint flags;
    ubyte neartemp;
    CLE;
    neartemp = RAM[getbyte(pc)];

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = y_reg;
    _AH = neartemp;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc++;
}